

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:889:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:889:17)>
             *this)

{
  undefined1 local_208 [28];
  int result;
  DebugComparison<int_&,_int> local_1e8;
  PromiseCrossThreadFulfillerPair<int> paf;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  newPromiseAndCrossThreadFulfiller<int>();
  local_1e8.right = (int)paf.fulfiller.ptr;
  local_1e8._12_4_ = paf.fulfiller.ptr._4_4_;
  paf.fulfiller.ptr = (CrossThreadPromiseFulfiller<int> *)0x0;
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<int>,_std::nullptr_t>_>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<int>,_std::nullptr_t>_>_> *)
             local_208,(this->f).fulfillerMutex);
  Own<kj::PromiseFulfiller<int>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<int>,_std::nullptr_t> *)local_208._8_8_,
             (Own<kj::PromiseFulfiller<int>,_std::nullptr_t> *)&local_1e8);
  Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<int>,_std::nullptr_t>_>_>::~Locked
            ((Locked<kj::Maybe<kj::Own<kj::PromiseFulfiller<int>,_std::nullptr_t>_>_> *)local_208);
  Own<kj::PromiseFulfiller<int>,_std::nullptr_t>::dispose
            ((Own<kj::PromiseFulfiller<int>,_std::nullptr_t> *)&local_1e8);
  local_208._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  local_208._8_8_ = "operator()";
  local_208._16_8_ = (Maybe<kj::_::Mutex::Waiter_&> *)0x120000037f;
  result = Promise<int>::wait(&paf.promise,&waitScope);
  local_1e8.left = &result;
  local_1e8.right = 0x7b;
  local_1e8.op.content.ptr = " == ";
  local_1e8.op.content.size_ = 5;
  local_1e8.result = result == 0x7b;
  if ((!local_1e8.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x380,ERROR,"\"failed: expected \" \"result == 123\", _kjCondition",
               (char (*) [31])"failed: expected result == 123",&local_1e8);
  }
  PromiseCrossThreadFulfillerPair<int>::~PromiseCrossThreadFulfillerPair(&paf);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }